

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

string * __thiscall
libaom_examples::(anonymous_namespace)::format_color_properties_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          pair<libaom_examples::ColorProperties,_bool> *color_properties)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (this[4] == (_anonymous_namespace_)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"absent",(allocator *)&bStack_f8);
  }
  else {
    std::__cxx11::to_string(&local_38,(uint)(byte)this[1]);
    std::operator+(&local_98,&local_38,"/");
    std::__cxx11::to_string(&local_b8,(uint)(byte)this[2]);
    std::operator+(&local_78,&local_98,&local_b8);
    std::operator+(&local_58,&local_78,"/");
    std::__cxx11::to_string(&local_d8,(uint)(byte)this[3]);
    std::operator+(&bStack_f8,&local_58,&local_d8);
    __rhs = "L";
    if (*this != (_anonymous_namespace_)0x0) {
      __rhs = "F";
    }
    std::operator+(__return_storage_ptr__,&bStack_f8,__rhs);
    std::__cxx11::string::~string((string *)&bStack_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_color_properties(
    const std::pair<ColorProperties, bool> &color_properties) {
  if (!color_properties.second) {
    return "absent";
  } else {
    return std::to_string(color_properties.first.color_primaries) + "/" +
           std::to_string(color_properties.first.transfer_characteristics) +
           "/" + std::to_string(color_properties.first.matrix_coefficients) +
           (color_properties.first.color_range ? "F" : "L");
  }
}